

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastInlineHasOwnProperty(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  DWORD offset;
  undefined4 *puVar4;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  LabelInstr *target;
  LabelInstr *labelTarget;
  IndirOpnd *pIVar8;
  RegOpnd *pRVar9;
  RegOpnd *opndType;
  LabelInstr *pLVar10;
  Opnd *pOVar11;
  RegOpnd *pRVar12;
  IntConstOpnd *pIVar13;
  LabelInstr *local_d8;
  bool local_cb;
  bool local_ca;
  byte local_c9;
  Opnd *enumeratingPrototype;
  LabelInstr *falseLabel;
  RegOpnd *cachedDataTypeOpnd;
  Opnd *canUseJitFastPathOpnd;
  Opnd *forInEnumeratorOpnd;
  RegOpnd *opndTaggedType;
  LabelInstr *notInlineSlotsLabel;
  RegOpnd *objectTypeOpnd;
  RegOpnd *inlineCacheOpnd;
  Instr *insertInstr;
  LabelInstr *cacheMissLabel;
  LabelInstr *labelHelper;
  LabelInstr *doneLabel;
  RegOpnd *pRStack_50;
  bool generateForInFastpath;
  RegOpnd *propOpnd;
  RegOpnd *thisObj;
  Opnd *pOStack_38;
  bool result;
  Opnd *argsOpnd [2];
  Instr *tmpInstr;
  Opnd *linkOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f18,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc2(instr);
  pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
  pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
  argsOpnd[1] = (Opnd *)(pSVar7->field_5).m_instrDef;
  memset(&stack0xffffffffffffffc8,0,0x10);
  thisObj._7_1_ = IR::Instr::FetchOperands(instr,&stack0xffffffffffffffc8,2);
  if (!(bool)thisObj._7_1_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f21,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((pOStack_38 == (Opnd *)0x0) || (argsOpnd[0] == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f22,"(argsOpnd[0] && argsOpnd[1])","argsOpnd[0] && argsOpnd[1]");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  thisObj._4_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(argsOpnd[0]);
  bVar2 = ValueType::IsNotString((ValueType *)((long)&thisObj + 4));
  local_c9 = 1;
  if (!bVar2) {
    thisObj._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(pOStack_38);
    bVar2 = ValueType::IsNotObject((ValueType *)((long)&thisObj + 2));
    local_c9 = 1;
    if (!bVar2) {
      bVar2 = IR::Opnd::IsRegOpnd(pOStack_38);
      local_c9 = 1;
      if (bVar2) {
        bVar2 = IR::Opnd::IsRegOpnd(argsOpnd[0]);
        local_c9 = bVar2 ^ 0xff;
      }
    }
  }
  if ((local_c9 & 1) == 0) {
    propOpnd = IR::Opnd::AsRegOpnd(pOStack_38);
    pRStack_50 = IR::Opnd::AsRegOpnd(argsOpnd[0]);
    doneLabel._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRStack_50->super_Opnd);
    bVar2 = ValueType::IsString((ValueType *)((long)&doneLabel + 4));
    local_ca = false;
    if ((bVar2) && (local_ca = false, (*(uint *)&pRStack_50->m_sym->field_0x18 & 1) != 0)) {
      local_cb = true;
      if (((pRStack_50->m_sym->field_5).m_instrDef)->m_opcode != BrOnEmpty) {
        local_cb = ((pRStack_50->m_sym->field_5).m_instrDef)->m_opcode == BrOnNotEmpty;
      }
      local_ca = local_cb;
    }
    doneLabel._7_1_ = local_ca;
    target = InsertLabel(false,instr->m_next);
    labelTarget = InsertLabel(true,instr);
    local_d8 = labelTarget;
    if ((doneLabel._7_1_ & 1) != 0) {
      local_d8 = IR::LabelInstr::New(Label,this->m_func,true);
    }
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&pRStack_50->super_Opnd,&labelTarget->super_Instr,labelTarget,
               false);
    pIVar8 = IR::IndirOpnd::New(pRStack_50,0,TyUint64,this->m_func,false);
    pOVar5 = LoadVTableValueOpnd(this,&labelTarget->super_Instr,VtablePropertyString);
    InsertCompareBranch(this,&pIVar8->super_Opnd,pOVar5,BrNeq_A,labelTarget,
                        &labelTarget->super_Instr,false);
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&propOpnd->super_Opnd,&labelTarget->super_Instr,labelTarget,false)
    ;
    pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
    pRVar12 = pRStack_50;
    uVar3 = Js::PropertyString::GetOffsetOfLdElemInlineCache();
    pIVar8 = IR::IndirOpnd::New(pRVar12,uVar3,TyUint64,this->m_func,false);
    InsertMove(&pRVar9->super_Opnd,&pIVar8->super_Opnd,&labelTarget->super_Instr,true);
    opndType = IR::RegOpnd::New(TyUint64,this->m_func);
    pRVar12 = propOpnd;
    uVar3 = Js::RecyclableObject::GetOffsetOfType();
    pIVar8 = IR::IndirOpnd::New(pRVar12,uVar3,TyUint64,this->m_func,false);
    InsertMove(&opndType->super_Opnd,&pIVar8->super_Opnd,&labelTarget->super_Instr,true);
    GenerateDynamicLoadPolymorphicInlineCacheSlot
              (this,&labelTarget->super_Instr,pRVar9,&opndType->super_Opnd);
    pLVar10 = IR::LabelInstr::New(Label,this->m_func,false);
    GenerateLocalInlineCacheCheck(&labelTarget->super_Instr,opndType,pRVar9,pLVar10,false);
    pOVar5 = IR::Instr::GetDst(instr);
    pOVar11 = LoadLibraryValueOpnd(this,instr,ValueTrue);
    InsertMove(pOVar5,pOVar11,&labelTarget->super_Instr,true);
    InsertBranch(Br,target,&labelTarget->super_Instr);
    IR::Instr::InsertBefore(&labelTarget->super_Instr,&pLVar10->super_Instr);
    pRVar12 = IR::RegOpnd::New(TyInt64,this->m_func);
    LowererMD::GenerateLoadTaggedType(&labelTarget->super_Instr,opndType,pRVar12);
    GenerateLocalInlineCacheCheck(&labelTarget->super_Instr,pRVar12,pRVar9,local_d8,false);
    pOVar5 = IR::Instr::GetDst(instr);
    pOVar11 = LoadLibraryValueOpnd(this,instr,ValueTrue);
    InsertMove(pOVar5,pOVar11,&labelTarget->super_Instr,true);
    InsertBranch(Br,target,&labelTarget->super_Instr);
    if ((doneLabel._7_1_ & 1) == 0) {
      RelocateCallDirectToHelperPath(this,(Instr *)argsOpnd[1],labelTarget);
    }
    else {
      IR::Instr::InsertBefore(&labelTarget->super_Instr,&local_d8->super_Instr);
      pRVar12 = IR::Opnd::AsRegOpnd(argsOpnd[0]);
      pOVar5 = IR::Instr::GetSrc1((pRVar12->m_sym->field_5).m_instrDef);
      uVar3 = Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath();
      pOVar11 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyInt8);
      pIVar13 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      InsertCompareBranch(this,pOVar11,&pIVar13->super_Opnd,BrEq_A,labelTarget,
                          &labelTarget->super_Instr,false);
      pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
      uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType();
      pOVar11 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint64);
      InsertMove(&pRVar9->super_Opnd,pOVar11,&labelTarget->super_Instr,true);
      pRVar12 = propOpnd;
      offset = Js::DynamicObject::GetOffsetOfType();
      pIVar8 = IR::IndirOpnd::New(pRVar12,offset,TyUint64,this->m_func,false);
      InsertCompareBranch(this,&pRVar9->super_Opnd,&pIVar8->super_Opnd,BrNeq_A,labelTarget,
                          &labelTarget->super_Instr,false);
      pLVar10 = IR::LabelInstr::New(Label,this->m_func,true);
      uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratingPrototype();
      pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyInt8);
      pIVar13 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      InsertCompareBranch(this,pOVar5,&pIVar13->super_Opnd,BrNeq_A,pLVar10,&labelTarget->super_Instr
                          ,false);
      pOVar5 = IR::Instr::GetDst(instr);
      pOVar11 = LoadLibraryValueOpnd(this,instr,ValueTrue);
      InsertMove(pOVar5,pOVar11,&labelTarget->super_Instr,true);
      InsertBranch(Br,target,&labelTarget->super_Instr);
      IR::Instr::InsertBefore(&labelTarget->super_Instr,&pLVar10->super_Instr);
      pOVar5 = IR::Instr::GetDst(instr);
      pOVar11 = LoadLibraryValueOpnd(this,instr,ValueFalse);
      InsertMove(pOVar5,pOVar11,&labelTarget->super_Instr,true);
      InsertBranch(Br,target,&labelTarget->super_Instr);
      RelocateCallDirectToHelperPath(this,(Instr *)argsOpnd[1],labelTarget);
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineHasOwnProperty(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = { 0 };
    bool result = instr->FetchOperands(argsOpnd, 2);
    Assert(result);
    AnalysisAssert(argsOpnd[0] && argsOpnd[1]);

    if (argsOpnd[1]->GetValueType().IsNotString()
        || argsOpnd[0]->GetValueType().IsNotObject()
        || !argsOpnd[0]->IsRegOpnd()
        || !argsOpnd[1]->IsRegOpnd())
    {
        return;
    }

    IR::RegOpnd * thisObj = argsOpnd[0]->AsRegOpnd();
    IR::RegOpnd * propOpnd = argsOpnd[1]->AsRegOpnd();

    // fast path case where hasOwnProperty is being called using a property name loaded via a for-in loop
    bool generateForInFastpath = propOpnd->GetValueType().IsString()
        && propOpnd->m_sym->m_isSingleDef
        && (propOpnd->m_sym->m_instrDef->m_opcode == Js::OpCode::BrOnEmpty
            || propOpnd->m_sym->m_instrDef->m_opcode == Js::OpCode::BrOnNotEmpty);

    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::LabelInstr * labelHelper = InsertLabel(true, instr);

    IR::LabelInstr * cacheMissLabel = generateForInFastpath ? IR::LabelInstr::New(Js::OpCode::Label, m_func, true) : labelHelper;

    IR::Instr * insertInstr = labelHelper;

    //    GenerateObjectTest(propOpnd, $labelHelper)
    //    CMP indexOpnd, PropertyString::`vtable'
    //    JNE $helper
    //    GenerateObjectTest(thisObj, $labelHelper)
    //    MOV inlineCacheOpnd, propOpnd->lsElemInlineCache
    //    MOV objectTypeOpnd, thisObj->type
    //    GenerateDynamicLoadPolymorphicInlineCacheSlot(inlineCacheOpnd, objectTypeOpnd)        ; loads inline cache for given type
    //    GenerateLocalInlineCacheCheck(objectTypeOpnd, inlineCacheOpnd, $notInlineSlotsLabel)  ; check for type in inline slots, jump to $notInlineSlotsLabel on failure
    //    MOV dst, ValueTrue
    //    JMP $done
    // $notInlineSlotsLabel:
    //    GenerateLoadTaggedType(objectTypeOpnd, opndTaggedType)
    //    GenerateLocalInlineCacheCheck(opndTaggedType, inlineCacheOpnd, $cacheMissLabel)       ; check for type in aux slot, jump to $cacheMissLabel on failure
    //    MOV dst, ValueTrue
    //    JMP $done

    m_lowererMD.GenerateObjectTest(propOpnd, insertInstr, labelHelper);

    InsertCompareBranch(IR::IndirOpnd::New(propOpnd, 0, TyMachPtr, m_func), LoadVTableValueOpnd(insertInstr, VTableValue::VtablePropertyString), Js::OpCode::BrNeq_A, labelHelper, insertInstr);

    m_lowererMD.GenerateObjectTest(thisObj, insertInstr, labelHelper);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(propOpnd, Js::PropertyString::GetOffsetOfLdElemInlineCache(), TyMachPtr, m_func), insertInstr);

    IR::RegOpnd * objectTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(objectTypeOpnd, IR::IndirOpnd::New(thisObj, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func), insertInstr);

    GenerateDynamicLoadPolymorphicInlineCacheSlot(insertInstr, inlineCacheOpnd, objectTypeOpnd);

    IR::LabelInstr * notInlineSlotsLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    GenerateLocalInlineCacheCheck(insertInstr, objectTypeOpnd, inlineCacheOpnd, notInlineSlotsLabel);

    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    insertInstr->InsertBefore(notInlineSlotsLabel);
    IR::RegOpnd * opndTaggedType = IR::RegOpnd::New(TyMachReg, m_func);
    m_lowererMD.GenerateLoadTaggedType(insertInstr, objectTypeOpnd, opndTaggedType);
    GenerateLocalInlineCacheCheck(insertInstr, opndTaggedType, inlineCacheOpnd, cacheMissLabel);
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    if (!generateForInFastpath)
    {
        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
        return;
    }

    insertInstr->InsertBefore(cacheMissLabel);

    //    CMP forInEnumeratorOpnd->canUseJitFastPath, 0
    //    JEQ $labelHelper
    //    MOV cachedDataTypeOpnd, forInEnumeratorOpnd->enumeratorInitialType
    //    CMP thisObj->type, cachedDataTypeOpnd
    //    JNE $labelHelper
    //    CMP forInEnumeratorOpnd->enumeratingPrototype, 0
    //    JNE $falseLabel
    //    MOV dst, True
    //    JMP $doneLabel
    //    $falseLabel: [helper]
    //    MOV dst, False
    //    JMP $doneLabel
    // $labelHelper: [helper]
    //    CallDirect code
    //    ...
    // $doneLabel:

    IR::Opnd * forInEnumeratorOpnd = argsOpnd[1]->AsRegOpnd()->m_sym->m_instrDef->GetSrc1();

    // go to helper if we can't use JIT fastpath
    IR::Opnd * canUseJitFastPathOpnd = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath(), TyInt8);
    InsertCompareBranch(canUseJitFastPathOpnd, IR::IntConstOpnd::New(0, TyInt8, m_func), Js::OpCode::BrEq_A, labelHelper, insertInstr);

    // go to helper if initial type is not same as the object we are querying
    IR::RegOpnd * cachedDataTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(cachedDataTypeOpnd, GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType(), TyMachPtr), insertInstr);
    InsertCompareBranch(cachedDataTypeOpnd, IR::IndirOpnd::New(thisObj, Js::DynamicObject::GetOffsetOfType(), TyMachPtr, m_func), Js::OpCode::BrNeq_A, labelHelper, insertInstr);

    // if we haven't yet gone to helper, then we can check if we are enumerating the prototype to know if property is an own property
    IR::LabelInstr *falseLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::Opnd * enumeratingPrototype = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratingPrototype(), TyInt8);
    InsertCompareBranch(enumeratingPrototype, IR::IntConstOpnd::New(0, TyInt8, m_func), Js::OpCode::BrNeq_A, falseLabel, insertInstr);

    // assume true is the main path
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    // load false on helper path
    insertInstr->InsertBefore(falseLabel);
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}